

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleFileMuxer.cpp
# Opt level: O0

void __thiscall SingleFileMuxer::writeOutBuffer(SingleFileMuxer *this,StreamInfo *streamInfo)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint8_t *__dest;
  char *pcVar4;
  char *__new;
  ostream *poVar5;
  VodCoreException *pVVar6;
  size_t __n;
  SingleFileMuxer *__src;
  StreamInfo *pSVar7;
  long local_3b8;
  string local_398;
  ostringstream local_378 [8];
  ostringstream ss_1;
  int systemFlags;
  ostringstream local_1d8 [8];
  ostringstream ss;
  undefined1 local_50 [8];
  string newName;
  LPCMStreamReader *lpcmReader;
  uint8_t *newBuf;
  int toFileLen;
  int blockSize;
  StreamInfo *streamInfo_local;
  SingleFileMuxer *this_local;
  
  __src = (SingleFileMuxer *)streamInfo;
  if (0x1fffff < streamInfo->m_bufLen) {
    bVar1 = MuxerManager::isAsyncMode((this->super_AbstractMuxer).m_owner);
    if (bVar1) {
      __dest = (uint8_t *)operator_new__(0x208000);
      memcpy(__dest,streamInfo->m_buffer + 0x200000,(long)(streamInfo->m_bufLen + -0x200000));
      __src = this;
      MuxerManager::asyncWriteBuffer
                ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,streamInfo->m_buffer
                 ,0x200000,(AbstractOutputStream *)streamInfo);
      streamInfo->m_buffer = __dest;
    }
    else {
      MuxerManager::syncWriteBuffer
                ((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer,streamInfo->m_buffer
                 ,0x200000,(AbstractOutputStream *)streamInfo);
      __src = (SingleFileMuxer *)(streamInfo->m_buffer + 0x200000);
      memmove(streamInfo->m_buffer,__src,(long)(streamInfo->m_bufLen + -0x200000));
    }
    streamInfo->m_totalWrited = streamInfo->m_totalWrited + 0x200000;
    streamInfo->m_bufLen = streamInfo->m_bufLen + -0x200000;
  }
  iVar2 = (int)__src;
  if (streamInfo->m_codecReader == (AbstractStreamReader *)0x0) {
    local_3b8 = 0;
  }
  else {
    iVar2 = 0x440080;
    local_3b8 = __dynamic_cast(streamInfo->m_codecReader,&AbstractStreamReader::typeinfo,
                               &LPCMStreamReader::typeinfo,0);
  }
  newName.field_2._8_8_ = local_3b8;
  if ((local_3b8 != 0) && (0xffdeffff < streamInfo->m_totalWrited)) {
    bVar1 = MuxerManager::isAsyncMode((this->super_AbstractMuxer).m_owner);
    if (bVar1) {
      MuxerManager::waitForWriting((this->super_AbstractMuxer).m_owner);
    }
    File::close(&streamInfo->m_file,iVar2);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    __n = 0;
    File::open(&streamInfo->m_file,pcVar4,6);
    iVar2 = (int)streamInfo->m_buffer;
    File::write(&streamInfo->m_file,iVar2,(void *)(ulong)(uint)streamInfo->m_bufLen,__n);
    File::close(&streamInfo->m_file,iVar2);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    File::open(&streamInfo->m_file,pcVar4,0x22,0);
    pSVar7 = streamInfo;
    LPCMStreamReader::beforeFileCloseEvent
              ((LPCMStreamReader *)newName.field_2._8_8_,&streamInfo->m_file);
    File::close(&streamInfo->m_file,(int)pSVar7);
    getNewName((string *)local_50,&streamInfo->m_fileName,streamInfo->m_part);
    deleteFile((string *)local_50);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    __new = (char *)std::__cxx11::string::c_str();
    iVar2 = rename(pcVar4,__new);
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1d8);
      poVar5 = std::operator<<((ostream *)local_1d8,"Can\'t rename file ");
      poVar5 = std::operator<<(poVar5,(string *)&streamInfo->m_fileName);
      poVar5 = std::operator<<(poVar5," to ");
      std::operator<<(poVar5,(string *)local_50);
      pVVar6 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar6,3,(string *)&systemFlags);
      __cxa_throw(pVVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    streamInfo->m_part = streamInfo->m_part + 1;
    streamInfo->m_bufLen = 0;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    uVar3 = File::open(&streamInfo->m_file,pcVar4,2,0);
    if ((uVar3 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_378);
      poVar5 = std::operator<<((ostream *)local_378,"Can\'t open file ");
      std::operator<<(poVar5,(string *)&streamInfo->m_fileName);
      pVVar6 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar6,3,&local_398);
      __cxa_throw(pVVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    LPCMStreamReader::setFirstFrame((LPCMStreamReader *)newName.field_2._8_8_,true);
    streamInfo->m_totalWrited = 0;
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void SingleFileMuxer::writeOutBuffer(StreamInfo* streamInfo)
{
    constexpr int blockSize = DEFAULT_FILE_BLOCK_SIZE;
    if (streamInfo->m_bufLen >= blockSize)
    {
        constexpr int toFileLen = blockSize & 0xffff0000;
        if (m_owner->isAsyncMode())
        {
            const auto newBuf = new uint8_t[blockSize + MAX_AV_PACKET_SIZE];
            memcpy(newBuf, streamInfo->m_buffer + toFileLen, streamInfo->m_bufLen - toFileLen);
            m_owner->asyncWriteBuffer(this, streamInfo->m_buffer, toFileLen, &streamInfo->m_file);
            streamInfo->m_buffer = newBuf;
        }
        else
        {
            m_owner->syncWriteBuffer(this, streamInfo->m_buffer, toFileLen, &streamInfo->m_file);
            memmove(streamInfo->m_buffer, streamInfo->m_buffer + toFileLen, streamInfo->m_bufLen - toFileLen);
        }
        streamInfo->m_totalWrited += toFileLen;
        streamInfo->m_bufLen -= toFileLen;
    }

    const auto lpcmReader = dynamic_cast<LPCMStreamReader*>(streamInfo->m_codecReader);
    if (lpcmReader && streamInfo->m_totalWrited >= 0xffff0000ul - blockSize)
    // if (lpcmReader && streamInfo->m_totalWrited >= 0x0ffffffful)
    {
        if (m_owner->isAsyncMode())
            m_owner->waitForWriting();
        streamInfo->m_file.close();
        streamInfo->m_file.open(streamInfo->m_fileName.c_str(), File::ofWrite + File::ofAppend);
        streamInfo->m_file.write(streamInfo->m_buffer, streamInfo->m_bufLen);
        streamInfo->m_file.close();
        streamInfo->m_file.open(streamInfo->m_fileName.c_str(), File::ofWrite + File::ofNoTruncate);
        lpcmReader->beforeFileCloseEvent(streamInfo->m_file);
        streamInfo->m_file.close();
        const std::string newName = getNewName(streamInfo->m_fileName, streamInfo->m_part);
        deleteFile(newName);
        if (rename(streamInfo->m_fileName.c_str(), newName.c_str()) != 0)
            THROW(ERR_COMMON, "Can't rename file " << streamInfo->m_fileName << " to " << newName)
        streamInfo->m_part++;
        int systemFlags = 0;
        streamInfo->m_bufLen = 0;
#ifdef _WIN32
        if (m_owner->isAsyncMode())
            systemFlags += FILE_FLAG_NO_BUFFERING;
#endif
        if (!streamInfo->m_file.open(streamInfo->m_fileName.c_str(), File::ofWrite + systemFlags))
            THROW(ERR_COMMON, "Can't open file " << streamInfo->m_fileName)
        lpcmReader->setFirstFrame(true);
        streamInfo->m_totalWrited = 0;
    }
}